

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preset.cpp
# Opt level: O3

void __thiscall
sf2cute::SFPreset::SFPreset
          (SFPreset *this,string *name,uint16_t preset_number,uint16_t bank,
          vector<sf2cute::SFPresetZone,_std::allocator<sf2cute::SFPresetZone>_> *zones)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pSVar3;
  undefined8 uVar4;
  pointer puVar5;
  pointer puVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  pointer pSVar8;
  __uniq_ptr_impl<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_> local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &(this->name_).field_2;
  (this->name_)._M_dataplus._M_p = (pointer)local_38;
  pcVar2 = (name->_M_dataplus)._M_p;
  paVar1 = &name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    uVar4 = *(undefined8 *)((long)&name->field_2 + 8);
    local_38->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->name_).field_2 + 8) = uVar4;
  }
  else {
    (this->name_)._M_dataplus._M_p = pcVar2;
    (this->name_).field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->name_)._M_string_length = name->_M_string_length;
  (name->_M_dataplus)._M_p = (pointer)paVar1;
  name->_M_string_length = 0;
  (name->field_2)._M_local_buf[0] = '\0';
  this->preset_number_ = preset_number;
  this->bank_ = bank;
  this->library_ = 0;
  this->genre_ = 0;
  *(undefined8 *)&this->morphology_ = 0;
  *(undefined8 *)
   ((long)&(this->zones_).
           super__Vector_base<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->zones_).
           super__Vector_base<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->zones_).
           super__Vector_base<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)
   ((long)&(this->global_zone_)._M_t.
           super___uniq_ptr_impl<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>
           ._M_t.
           super__Tuple_impl<0UL,_sf2cute::SFPresetZone_*,_std::default_delete<sf2cute::SFPresetZone>_>
           .super__Head_base<0UL,_sf2cute::SFPresetZone_*,_false>._M_head_impl + 4) = 0;
  *(undefined4 *)((long)&this->parent_file_ + 4) = 0;
  std::
  vector<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>_>_>
  ::reserve(&this->zones_,
            ((long)(zones->
                   super__Vector_base<sf2cute::SFPresetZone,_std::allocator<sf2cute::SFPresetZone>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(zones->
                   super__Vector_base<sf2cute::SFPresetZone,_std::allocator<sf2cute::SFPresetZone>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333);
  pSVar8 = (zones->super__Vector_base<sf2cute::SFPresetZone,_std::allocator<sf2cute::SFPresetZone>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pSVar3 = (zones->super__Vector_base<sf2cute::SFPresetZone,_std::allocator<sf2cute::SFPresetZone>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pSVar8 != pSVar3) {
    do {
      local_40._M_t.
      super__Tuple_impl<0UL,_sf2cute::SFPresetZone_*,_std::default_delete<sf2cute::SFPresetZone>_>.
      super__Head_base<0UL,_sf2cute::SFPresetZone_*,_false>._M_head_impl =
           (tuple<sf2cute::SFPresetZone_*,_std::default_delete<sf2cute::SFPresetZone>_>)
           operator_new(0x50);
      puVar5 = (pSVar8->super_SFZone).generators_.
               super__Vector_base<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      (((vector<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>
         *)((long)local_40._M_t.
                  super__Tuple_impl<0UL,_sf2cute::SFPresetZone_*,_std::default_delete<sf2cute::SFPresetZone>_>
                  .super__Head_base<0UL,_sf2cute::SFPresetZone_*,_false>._M_head_impl + 8))->
      super__Vector_base<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start =
           (pSVar8->super_SFZone).generators_.
           super__Vector_base<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      *(pointer *)
       ((long)local_40._M_t.
              super__Tuple_impl<0UL,_sf2cute::SFPresetZone_*,_std::default_delete<sf2cute::SFPresetZone>_>
              .super__Head_base<0UL,_sf2cute::SFPresetZone_*,_false>._M_head_impl + 0x10) = puVar5;
      *(pointer *)
       ((long)local_40._M_t.
              super__Tuple_impl<0UL,_sf2cute::SFPresetZone_*,_std::default_delete<sf2cute::SFPresetZone>_>
              .super__Head_base<0UL,_sf2cute::SFPresetZone_*,_false>._M_head_impl + 0x18) =
           (pSVar8->super_SFZone).generators_.
           super__Vector_base<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (pSVar8->super_SFZone).generators_.
      super__Vector_base<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pSVar8->super_SFZone).generators_.
      super__Vector_base<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pSVar8->super_SFZone).generators_.
      super__Vector_base<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      puVar6 = (pSVar8->super_SFZone).modulators_.
               super__Vector_base<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      (((vector<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>_>_>
         *)((long)local_40._M_t.
                  super__Tuple_impl<0UL,_sf2cute::SFPresetZone_*,_std::default_delete<sf2cute::SFPresetZone>_>
                  .super__Head_base<0UL,_sf2cute::SFPresetZone_*,_false>._M_head_impl + 0x20))->
      super__Vector_base<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start =
           (pSVar8->super_SFZone).modulators_.
           super__Vector_base<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      *(pointer *)
       ((long)local_40._M_t.
              super__Tuple_impl<0UL,_sf2cute::SFPresetZone_*,_std::default_delete<sf2cute::SFPresetZone>_>
              .super__Head_base<0UL,_sf2cute::SFPresetZone_*,_false>._M_head_impl + 0x28) = puVar6;
      *(pointer *)
       ((long)local_40._M_t.
              super__Tuple_impl<0UL,_sf2cute::SFPresetZone_*,_std::default_delete<sf2cute::SFPresetZone>_>
              .super__Head_base<0UL,_sf2cute::SFPresetZone_*,_false>._M_head_impl + 0x30) =
           (pSVar8->super_SFZone).modulators_.
           super__Vector_base<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (pSVar8->super_SFZone).modulators_.
      super__Vector_base<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pSVar8->super_SFZone).modulators_.
      super__Vector_base<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pSVar8->super_SFZone).modulators_.
      super__Vector_base<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      *(undefined ***)
       local_40._M_t.
       super__Tuple_impl<0UL,_sf2cute::SFPresetZone_*,_std::default_delete<sf2cute::SFPresetZone>_>.
       super__Head_base<0UL,_sf2cute::SFPresetZone_*,_false>._M_head_impl =
           &PTR__SFPresetZone_0011e830;
      p_Var7 = (pSVar8->instrument_).
               super___weak_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      (((weak_ptr<sf2cute::SFInstrument> *)
       ((long)local_40._M_t.
              super__Tuple_impl<0UL,_sf2cute::SFPresetZone_*,_std::default_delete<sf2cute::SFPresetZone>_>
              .super__Head_base<0UL,_sf2cute::SFPresetZone_*,_false>._M_head_impl + 0x38))->
      super___weak_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           (pSVar8->instrument_).super___weak_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
      ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
      ((long)local_40._M_t.
             super__Tuple_impl<0UL,_sf2cute::SFPresetZone_*,_std::default_delete<sf2cute::SFPresetZone>_>
             .super__Head_base<0UL,_sf2cute::SFPresetZone_*,_false>._M_head_impl + 0x40))->_M_pi =
           p_Var7;
      (pSVar8->instrument_).super___weak_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      (pSVar8->instrument_).super___weak_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      *(SFPreset **)
       ((long)local_40._M_t.
              super__Tuple_impl<0UL,_sf2cute::SFPresetZone_*,_std::default_delete<sf2cute::SFPresetZone>_>
              .super__Head_base<0UL,_sf2cute::SFPresetZone_*,_false>._M_head_impl + 0x48) =
           pSVar8->parent_preset_;
      std::
      vector<std::unique_ptr<sf2cute::SFPresetZone,std::default_delete<sf2cute::SFPresetZone>>,std::allocator<std::unique_ptr<sf2cute::SFPresetZone,std::default_delete<sf2cute::SFPresetZone>>>>
      ::
      emplace_back<std::unique_ptr<sf2cute::SFPresetZone,std::default_delete<sf2cute::SFPresetZone>>>
                ((vector<std::unique_ptr<sf2cute::SFPresetZone,std::default_delete<sf2cute::SFPresetZone>>,std::allocator<std::unique_ptr<sf2cute::SFPresetZone,std::default_delete<sf2cute::SFPresetZone>>>>
                  *)&this->zones_,
                 (unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_> *)
                 &local_40);
      if ((_Tuple_impl<0UL,_sf2cute::SFPresetZone_*,_std::default_delete<sf2cute::SFPresetZone>_>)
          local_40._M_t.
          super__Tuple_impl<0UL,_sf2cute::SFPresetZone_*,_std::default_delete<sf2cute::SFPresetZone>_>
          .super__Head_base<0UL,_sf2cute::SFPresetZone_*,_false>._M_head_impl != (SFPresetZone *)0x0
         ) {
        (**(code **)(*(long *)local_40._M_t.
                              super__Tuple_impl<0UL,_sf2cute::SFPresetZone_*,_std::default_delete<sf2cute::SFPresetZone>_>
                              .super__Head_base<0UL,_sf2cute::SFPresetZone_*,_false>._M_head_impl +
                    8))();
      }
      pSVar8 = pSVar8 + 1;
    } while (pSVar8 != pSVar3);
  }
  SetBackwardReferences(this);
  return;
}

Assistant:

SFPreset::SFPreset(std::string name,
    uint16_t preset_number,
    uint16_t bank,
    std::vector<SFPresetZone> zones) :
    name_(std::move(name)),
    preset_number_(std::move(preset_number)),
    bank_(std::move(bank)),
    library_(0),
    genre_(0),
    morphology_(0),
    zones_(),
    global_zone_(nullptr),
    parent_file_(nullptr) {
  // Set preset zones.
  zones_.reserve(zones.size());
  for (auto && zone : zones) {
    zones_.push_back(std::make_unique<SFPresetZone>(std::move(zone)));
  }

  // Repair references.
  SetBackwardReferences();
}